

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

void __thiscall wallet::coinselector_tests::waste_test::test_method(waste_test *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  _Base_ptr local_2a0;
  assertion_result local_298;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  _Base_ptr local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  CAmount excess;
  CAmount change_cost;
  undefined1 local_200 [8];
  assertion_result local_1f8;
  char *local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [24];
  CAmount target_waste1;
  lazy_ostream local_1a8;
  undefined1 *local_198;
  CAmount *local_190;
  SelectionResult selection3;
  SelectionResult selection2;
  SelectionResult selection1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  change_cost = 0x7d;
  excess = 0x50;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x3c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x3c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x3c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x380;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  target_waste1 = 0xcd;
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection1);
  local_1d8._0_8_ = local_200;
  local_1c8._0_8_ = &target_waste1;
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((undefined1  [8])target_waste1 == local_200);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x2;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80e9f,(size_t)&local_298,0x380,&selection2,
             "selection1.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  p_Var1 = &selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection2.m_target = 200000000;
  selection2.m_algo = MANUAL;
  selection2.m_use_effective = false;
  selection2.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection2.m_algo_completed = true;
  selection2.m_weight = 0;
  selection2.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  add_coin((CAmount *)&selection3,1,&selection2,200,0x3c);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x3c;
  add_coin((CAmount *)&selection3,2,&selection2,200,0x3c);
  SelectionResult::RecalculateWaste(&selection2,300,0x7d,0x1e);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x387;
  file_00.m_begin = (iterator)&local_240;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_250,
             msg_00);
  local_1f8.m_message.px = (element_type *)((ulong)local_1f8.m_message.px & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection2);
  local_258 = (_Base_ptr)SelectionResult::GetWaste(&selection1);
  target_waste1 = (CAmount)&local_258;
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((long)local_258 < (long)local_200);
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = &target_waste1;
  pvVar4 = (iterator)0x6;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1f8,1,6,REQUIRE,0xf80ed0,(size_t)local_1c8,0x387,
             &selection3,"selection1.GetWaste()",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection3.m_target = 200000000;
  selection3.m_algo = MANUAL;
  selection3.m_use_effective = false;
  selection3.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection3.m_algo_completed = true;
  selection3.m_weight = 0;
  selection3.bump_fee_group_discount = 0;
  local_1a8._vptr_lazy_ostream = (_func_int **)0x5f5e100;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&local_1a8,1,&selection3,100,0x8c);
  local_1a8._vptr_lazy_ostream = (_func_int **)0xbebc200;
  pvVar3 = (iterator)0x8c;
  add_coin((CAmount *)&local_1a8,2,&selection3,100,0x8c);
  SelectionResult::RecalculateWaste(&selection3,300,0x7d,0x1e);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x38f;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_258 = (_Base_ptr)0x2d;
  local_2a0 = (_Base_ptr)SelectionResult::GetWaste(&selection3);
  local_1c8._8_8_ = (element_type *)0x0;
  local_1c8._16_8_ = (_Base_ptr)0x0;
  local_1d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1d8._8_8_ = "";
  target_waste1 = (CAmount)&local_258;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = &target_waste1;
  local_1f8.m_message.px = (element_type *)((ulong)local_1f8.m_message.px & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_200 = (undefined1  [8])&local_2a0;
  local_1c8[0] = (class_property<bool>)(class_property<bool>)(local_258 == local_2a0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)&local_298,1,2,REQUIRE,0xf80ee6,
             (size_t)local_1d8,0x38f,&local_1a8,"selection3.GetWaste()",&local_1f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x390;
  file_02.m_begin = (iterator)&local_2b0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2c0,
             msg_02);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_258 = (_Base_ptr)SelectionResult::GetWaste(&selection3);
  local_2a0 = (_Base_ptr)SelectionResult::GetWaste(&selection1);
  local_1c8[0] = (class_property<bool>)(class_property<bool>)((long)local_258 < (long)local_2a0);
  local_1c8._8_8_ = (element_type *)0x0;
  local_1c8._16_8_ = (_Base_ptr)0x0;
  local_1d8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1d8._8_8_ = "";
  target_waste1 = (CAmount)&local_258;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = &target_waste1;
  local_1f8.m_message.px = (element_type *)((ulong)local_1f8.m_message.px & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar4 = (iterator)0x4;
  local_200 = (undefined1  [8])&local_2a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)&local_298,1,4,REQUIRE,0xf80f02,
             (size_t)local_1d8,0x390,&local_1a8,"selection1.GetWaste()",&local_1f8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 0x10));
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection3);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection2);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x3c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x3c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x3c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x399;
  file_03.m_begin = (iterator)&local_2d0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e0,
             msg_03);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  target_waste1 = 0xa0;
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((undefined1  [8])target_waste1 == local_200);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = &target_waste1;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80f18,(size_t)&local_298,0x399,&selection2,
             "selection_nochange1.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection2.m_target = 0x11e1a1e8;
  selection2.m_algo = MANUAL;
  selection2.m_use_effective = false;
  selection2.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection2.m_algo_completed = true;
  selection2.m_weight = 0;
  selection2.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  add_coin((CAmount *)&selection3,1,&selection2,100,0x8c);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x8c;
  add_coin((CAmount *)&selection3,2,&selection2,100,0x8c);
  SelectionResult::RecalculateWaste(&selection2,300,0x7d,0x1e);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3a1;
  file_04.m_begin = (iterator)&local_2f0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_300,
             msg_04);
  local_1f8.m_message.px = (element_type *)((ulong)local_1f8.m_message.px & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_200 = (undefined1  [8])0x0;
  local_258 = (_Base_ptr)SelectionResult::GetWaste(&selection2);
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  target_waste1 = (CAmount)&local_258;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = &target_waste1;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_200 == (undefined1  [8])local_258);
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1f8,1,2,REQUIRE,0xf80f4d,(size_t)local_1c8,0x3a1,
             &selection3,"selection_nochange2.GetWaste()",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x3a2;
  file_05.m_begin = (iterator)&local_310;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320,
             msg_05);
  local_1f8.m_message.px = (element_type *)((ulong)local_1f8.m_message.px & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection2);
  local_258 = (_Base_ptr)SelectionResult::GetWaste(&selection1);
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((long)local_200 < (long)local_258);
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1c8._8_8_ = "";
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  target_waste1 = (CAmount)&local_258;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = &target_waste1;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1f8,1,4,REQUIRE,0xf80f64,(size_t)local_1c8,0x3a2,
             &selection3,"selection_nochange1.GetWaste()",&local_1a8);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection2);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3ab;
  file_06.m_begin = (iterator)&local_330;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_340,
             msg_06);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  target_waste1 = SelectionResult::GetWaste(&selection1);
  local_1c8._0_8_ = &change_cost;
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = &target_waste1;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(change_cost == target_waste1);
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80eae,(size_t)&local_298,0x3ab,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3b4;
  file_07.m_begin = (iterator)&local_350;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_360,
             msg_07);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  target_waste1 = SelectionResult::GetWaste(&selection1);
  local_1c8._0_8_ = &excess;
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(excess == target_waste1);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = &target_waste1;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80f27,(size_t)&local_298,0x3b4,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a238;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x3bd;
  file_08.m_begin = (iterator)&local_370;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_380,
             msg_08);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  target_waste1 = SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(target_waste1 == (int)local_200._0_4_);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = local_200;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = &target_waste1;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xfbe1bd,(size_t)&local_298,0x3bd,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x50,0x1e);
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x3c6;
  file_09.m_begin = (iterator)&local_390;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3a0,
             msg_09);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  target_waste1 = SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(target_waste1 == (int)local_200._0_4_);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = local_200;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = &target_waste1;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xfbe1bd,(size_t)&local_298,0x3c6,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x3d0;
  file_10.m_begin = (iterator)&local_3b0;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3c0,
             msg_10);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  target_waste1 = SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(target_waste1 == (int)local_200._0_4_);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = local_200;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = &target_waste1;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xfbe1bd,(size_t)&local_298,0x3d0,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a238;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  target_waste1 = -0x50;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x3da;
  file_11.m_begin = (iterator)&local_3d0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e0,
             msg_11);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1  [8])target_waste1 == local_200);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = &target_waste1;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  pvVar4 = (iterator)0x2;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80f98,(size_t)&local_298,0x3da,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  target_waste1 = -0x37;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0xbe);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar3 = (iterator)0xbe;
  add_coin((CAmount *)&selection2,2,&selection1,100,0xbe);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x3e9;
  file_12.m_begin = (iterator)&local_3f0;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_400,
             msg_12);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = (CAmount *)0xf6cf21;
  local_200 = (undefined1  [8])SelectionResult::GetWaste(&selection1);
  local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((undefined1  [8])target_waste1 == local_200);
  local_1f8.m_message.px = (element_type *)0x0;
  local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_298._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_298.m_message.px = (element_type *)0xf800bd;
  local_1c8._0_8_ = &target_waste1;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  local_1d8._0_8_ = local_200;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1d8;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,&local_1a8,1,2,REQUIRE,0xf80fa6,(size_t)&local_298,0x3e9,&selection2,
             "selection.GetWaste()",&selection3);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(waste_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{300};
    const CAmount change_cost{125};
    const CAmount change_fee{30};
    const CAmount fee_diff{40};
    const CAmount in_amt{3 * COIN};
    const CAmount target{2 * COIN};
    const CAmount excess{80};
    const CAmount exact_target{in_amt - fee * 2}; // Maximum spendable amount after fees: no change, no excess

    // In the following, we test that the waste is calculated correctly in various scenarios.
    // Usually, RecalculateWaste would compute change_fee and change_cost on basis of the
    // change output type, current feerate, and discard_feerate, but we use fixed values
    // across this test to make the test easier to understand.
    {
        // Waste with change is the change cost and difference between fee and long term fee
        SelectionResult selection1{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection1, /*fee=*/fee, /*long_term_fee=*/fee - fee_diff);
        add_coin(2 * COIN, 2, selection1, fee, fee - fee_diff);
        selection1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + change_cost, selection1.GetWaste());

        // Waste will be greater when fee is greater, but long term fee is the same
        SelectionResult selection2{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection2, fee * 2, fee - fee_diff);
        add_coin(2 * COIN, 2, selection2, fee * 2, fee - fee_diff);
        selection2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_GT(selection2.GetWaste(), selection1.GetWaste());

        // Waste with change is the change cost and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection3{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection3, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection3, fee, fee + fee_diff);
        selection3.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + change_cost, selection3.GetWaste());
        BOOST_CHECK_LT(selection3.GetWaste(), selection1.GetWaste());
    }

    {
        // Waste without change is the excess and difference between fee and long term fee
        SelectionResult selection_nochange1{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange1, fee, fee - fee_diff);
        add_coin(2 * COIN, 2, selection_nochange1, fee, fee - fee_diff);
        selection_nochange1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + excess, selection_nochange1.GetWaste());

        // Waste without change is the excess and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection_nochange2{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange2, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection_nochange2, fee, fee + fee_diff);
        selection_nochange2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + excess, selection_nochange2.GetWaste());
        BOOST_CHECK_LT(selection_nochange2.GetWaste(), selection_nochange1.GetWaste());
    }

    {
        // Waste with change and fee == long term fee is just cost of change
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(change_cost, selection.GetWaste());
    }

    {
        // Waste without change and fee == long term fee is just the excess
        SelectionResult selection{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(excess, selection.GetWaste());
    }

    {
        // Waste is 0 when fee == long_term_fee, no change, and no excess
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost , change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-cost_of_change), and no excess
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, /*change_cost=*/fee_diff * 2, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-excess), no change cost
        const CAmount new_target{exact_target - /*excess=*/fee_diff * 2};
        SelectionResult selection{new_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and the selected value == target
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        const CAmount target_waste1{-2 * fee_diff}; // = (2 * fee) - (2 * (fee + fee_diff))
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste1, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and change_cost < - (inputs * (fee - long_term_fee))
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        const CAmount large_fee_diff{90};
        const CAmount target_waste2{-2 * large_fee_diff + change_cost};
        // = (2 * fee) - (2 * (fee + large_fee_diff)) + change_cost
        // = (2 * 100) - (2 * (100 + 90)) + 125
        // = 200 - 380 + 125 = -55
        assert(target_waste2 == -55);
        add_coin(1 * COIN, 1, selection, fee, fee + large_fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + large_fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste2, selection.GetWaste());
    }
}